

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O2

size_t ZSTD_ldm_gear_feed(ldmRollingHashState_t *state,BYTE *data,size_t size,size_t *splits,
                         uint *numSplits)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  uint uVar5;
  U64 UVar6;
  
  UVar6 = state->rolling;
  uVar2 = state->stopMask;
  for (sVar4 = 2; uVar1 = sVar4 + 1, uVar1 < size; sVar4 = sVar4 + 4) {
    UVar6 = UVar6 * 2 + ZSTD_ldm_gearTab[data[sVar4 - 2]];
    if ((UVar6 & uVar2) == 0) {
      uVar5 = *numSplits;
      splits[uVar5] = sVar4 - 1;
      uVar5 = uVar5 + 1;
      *numSplits = uVar5;
      sVar3 = sVar4 - 1;
      if (uVar5 == 0x40) goto LAB_00666d6d;
    }
    UVar6 = UVar6 * 2 + ZSTD_ldm_gearTab[data[sVar4 - 1]];
    if ((UVar6 & uVar2) == 0) {
      uVar5 = *numSplits;
      splits[uVar5] = sVar4;
      uVar5 = uVar5 + 1;
      *numSplits = uVar5;
      sVar3 = sVar4;
      if (uVar5 == 0x40) goto LAB_00666d6d;
    }
    UVar6 = UVar6 * 2 + ZSTD_ldm_gearTab[data[sVar4]];
    if ((UVar6 & uVar2) == 0) {
      uVar5 = *numSplits;
      splits[uVar5] = uVar1;
      uVar5 = uVar5 + 1;
      *numSplits = uVar5;
      sVar3 = uVar1;
      if (uVar5 == 0x40) goto LAB_00666d6d;
    }
    UVar6 = UVar6 * 2 + ZSTD_ldm_gearTab[data[sVar4 + 1]];
    if ((UVar6 & uVar2) == 0) {
      sVar3 = sVar4 + 2;
      uVar5 = *numSplits;
      splits[uVar5] = sVar3;
      uVar5 = uVar5 + 1;
      *numSplits = uVar5;
      if (uVar5 == 0x40) goto LAB_00666d6d;
    }
  }
  sVar4 = sVar4 - 2;
  do {
    do {
      sVar3 = sVar4;
      if (size <= sVar3) goto LAB_00666d6d;
      UVar6 = UVar6 * 2 + ZSTD_ldm_gearTab[data[sVar3]];
      sVar4 = sVar3 + 1;
    } while ((UVar6 & uVar2) != 0);
    uVar5 = *numSplits;
    splits[uVar5] = sVar4;
    uVar5 = uVar5 + 1;
    *numSplits = uVar5;
  } while (uVar5 != 0x40);
  sVar3 = sVar3 + 1;
LAB_00666d6d:
  state->rolling = UVar6;
  return sVar3;
}

Assistant:

static size_t ZSTD_ldm_gear_feed(ldmRollingHashState_t* state,
                                 BYTE const* data, size_t size,
                                 size_t* splits, unsigned* numSplits)
{
    size_t n;
    U64 hash, mask;

    hash = state->rolling;
    mask = state->stopMask;
    n = 0;

#define GEAR_ITER_ONCE() do { \
        hash = (hash << 1) + ZSTD_ldm_gearTab[data[n] & 0xff]; \
        n += 1; \
        if (UNLIKELY((hash & mask) == 0)) { \
            splits[*numSplits] = n; \
            *numSplits += 1; \
            if (*numSplits == LDM_BATCH_SIZE) \
                goto done; \
        } \
    } while (0)

    while (n + 3 < size) {
        GEAR_ITER_ONCE();
        GEAR_ITER_ONCE();
        GEAR_ITER_ONCE();
        GEAR_ITER_ONCE();
    }
    while (n < size) {
        GEAR_ITER_ONCE();
    }

#undef GEAR_ITER_ONCE

done:
    state->rolling = hash;
    return n;
}